

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcRelAggregates>
                 (DB *db,LIST *params,IfcRelAggregates *in)

{
  size_t sVar1;
  TypeError *this;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcRelAggregates *in_local;
  LIST *params_local;
  DB *db_local;
  
  base = (size_t)in;
  in_local = (IfcRelAggregates *)params;
  params_local = (LIST *)db;
  local_28 = GenericFill<Assimp::IFC::Schema_2x3::IfcRelDecomposes>
                       (db,params,&in->super_IfcRelDecomposes);
  sVar1 = EXPRESS::LIST::GetSize((LIST *)in_local);
  if (sVar1 < 6) {
    this = (TypeError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"expected 6 arguments to IfcRelAggregates",&local_49);
    TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
    __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
  }
  return local_28;
}

Assistant:

size_t GenericFill<IfcRelAggregates>(const DB& db, const LIST& params, IfcRelAggregates* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcRelDecomposes*>(in));
	if (params.GetSize() < 6) { throw STEP::TypeError("expected 6 arguments to IfcRelAggregates"); }	return base;
}